

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UserManager.hpp
# Opt level: O2

bool __thiscall sjtu::UserManager::is_login(UserManager *this,string *username)

{
  BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_> *this_00;
  int iVar1;
  undefined4 extraout_var;
  bool bVar2;
  pair<long,_bool> pVar3;
  long local_58;
  char local_50;
  hashType local_48;
  string local_40;
  
  this_00 = this->UserBpTree;
  std::__cxx11::string::string((string *)&local_40,(string *)username);
  local_48 = StringHasher::operator()((StringHasher *)this,&local_40);
  pVar3 = BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_>::find
                    (this_00,&local_48);
  local_58 = pVar3.first;
  local_50 = pVar3.second;
  std::__cxx11::string::~string((string *)&local_40);
  if (pVar3.second == false) {
    bVar2 = false;
  }
  else {
    iVar1 = (*(this->UserFile->super_FileManager_Base<sjtu::userType>)._vptr_FileManager_Base[2])
                      (this->UserFile,&local_58);
    bVar2 = *(uint *)(CONCAT44(extraout_var,iVar1) + 0x6c) == this->online_flag;
  }
  return bVar2;
}

Assistant:

bool is_login(std::string username) {
            std::pair<locType, bool> tmp = UserBpTree->find(hasher(username));
            if (tmp.second == false) return false;
            else {
                userType *cur = UserFile->read(tmp.first);
                return cur->is_online == online_flag;
            }
        }